

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

int Waitany(IceTCommunicator self,int count,IceTCommRequest *array_of_requests)

{
  MPI_Request poVar1;
  int local_34;
  void *pvStack_30;
  int idx;
  MPI_Request *mpi_requests;
  IceTCommRequest *array_of_requests_local;
  IceTCommunicator pIStack_18;
  int count_local;
  IceTCommunicator self_local;
  
  mpi_requests = (MPI_Request *)array_of_requests;
  array_of_requests_local._4_4_ = count;
  pIStack_18 = self;
  pvStack_30 = malloc((long)count << 3);
  if (pvStack_30 == (void *)0x0) {
    icetRaiseDiagnostic("Could not allocate array for MPI requests.",0xfffffffc,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x1b7);
    self_local._4_4_ = -1;
  }
  else {
    for (local_34 = 0; local_34 < array_of_requests_local._4_4_; local_34 = local_34 + 1) {
      poVar1 = getMPIRequest((IceTCommRequest)mpi_requests[local_34]);
      *(MPI_Request *)((long)pvStack_30 + (long)local_34 * 8) = poVar1;
    }
    MPI_Waitany(array_of_requests_local._4_4_,pvStack_30,&local_34,0);
    setMPIRequest((IceTCommRequest)mpi_requests[local_34],
                  *(MPI_Request *)((long)pvStack_30 + (long)local_34 * 8));
    destroy_request((IceTCommRequest)mpi_requests[local_34]);
    mpi_requests[local_34] = (MPI_Request)0x0;
    free(pvStack_30);
    self_local._4_4_ = local_34;
  }
  return self_local._4_4_;
}

Assistant:

static int  Waitany(IceTCommunicator self,
                    int count, IceTCommRequest *array_of_requests)
{
    MPI_Request *mpi_requests;
    int idx;

    /* To remove warning */
    (void)self;

    mpi_requests = malloc(sizeof(MPI_Request)*count);
    if (mpi_requests == NULL) {
        icetRaiseError("Could not allocate array for MPI requests.",
                       ICET_OUT_OF_MEMORY);
        return -1;
    }

    for (idx = 0; idx < count; idx++) {
        mpi_requests[idx] = getMPIRequest(array_of_requests[idx]);
    }

    MPI_Waitany(count, mpi_requests, &idx, MPI_STATUS_IGNORE);

    setMPIRequest(array_of_requests[idx], mpi_requests[idx]);
    destroy_request(array_of_requests[idx]);
    array_of_requests[idx] = ICET_COMM_REQUEST_NULL;

    free(mpi_requests);

    return idx;
}